

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O3

void array_get_bang(t_array_rangeop *x)

{
  _outlet *p_Var1;
  int iVar2;
  t_atom *argv;
  char *pcVar3;
  size_t sVar4;
  t_atom *argv_00;
  long lVar5;
  undefined8 uStack_50;
  t_atom tStack_48;
  char *pcStack_38;
  int arrayonset;
  char *firstitem;
  int stride;
  int nitem;
  
  argv_00 = &tStack_48;
  uStack_50 = 0x17b2a7;
  iVar2 = array_rangeop_getrange
                    (x,&stack0xffffffffffffffc8,(int *)((long)&firstitem + 4),(int *)&firstitem,
                     (int *)((long)&tStack_48.a_w + 4));
  if (iVar2 != 0) {
    lVar5 = (long)firstitem._4_4_;
    if (lVar5 < 100) {
      argv_00 = &tStack_48 + -lVar5;
      argv = argv_00;
      if (firstitem._4_4_ < 1) {
        p_Var1 = (x->x_tc).tc_obj.te_outlet;
        (&uStack_50)[lVar5 * -2] = 0x17b2df;
        outlet_list(p_Var1,(t_symbol *)0x0,firstitem._4_4_,argv_00);
        return;
      }
    }
    else {
      uStack_50 = 0x17b2ed;
      argv = (t_atom *)getbytes(lVar5 << 4);
    }
    sVar4 = 0;
    pcVar3 = pcStack_38;
    do {
      *(undefined4 *)((long)&argv->a_type + sVar4) = 1;
      *(undefined4 *)((long)&argv->a_w + sVar4) = *(undefined4 *)pcVar3;
      pcVar3 = pcVar3 + (int)firstitem;
      sVar4 = sVar4 + 0x10;
    } while (lVar5 << 4 != sVar4);
    p_Var1 = (x->x_tc).tc_obj.te_outlet;
    argv_00[-1].a_w.w_symbol = (t_symbol *)0x17b331;
    outlet_list(p_Var1,(t_symbol *)0x0,firstitem._4_4_,argv);
    if (99 < firstitem._4_4_) {
      argv_00[-1].a_w.w_symbol = (t_symbol *)0x17b342;
      freebytes(argv,lVar5 << 4);
    }
  }
  return;
}

Assistant:

static void array_get_bang(t_array_rangeop *x)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    t_atom *outv;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    ATOMS_ALLOCA(outv, nitem);
    for (i = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        SETFLOAT(&outv[i],  *(t_float *)itemp);
    outlet_list(x->x_outlet, 0, nitem, outv);
    ATOMS_FREEA(outv, nitem);
}